

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void tablerehash(TString **vect,int osize,int nsize)

{
  TString *pTVar1;
  long lVar2;
  ulong uVar3;
  TString *pTVar4;
  int i;
  ulong uVar5;
  uint uVar6;
  
  for (lVar2 = (long)osize; lVar2 < nsize; lVar2 = lVar2 + 1) {
    vect[lVar2] = (TString *)0x0;
  }
  uVar3 = 0;
  uVar5 = (ulong)(uint)osize;
  if (osize < 1) {
    uVar5 = uVar3;
  }
  for (; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    pTVar4 = vect[uVar3];
    vect[uVar3] = (TString *)0x0;
    while (pTVar4 != (TString *)0x0) {
      pTVar1 = (pTVar4->u).hnext;
      uVar6 = pTVar4->hash & nsize - 1U;
      pTVar4->u = *(anon_union_8_2_b887aad4_for_u *)(vect + uVar6);
      vect[uVar6] = pTVar4;
      pTVar4 = pTVar1;
    }
  }
  return;
}

Assistant:

static void tablerehash (TString **vect, int osize, int nsize) {
  int i;
  for (i = osize; i < nsize; i++)  /* clear new elements */
    vect[i] = NULL;
  for (i = 0; i < osize; i++) {  /* rehash old part of the array */
    TString *p = vect[i];
    vect[i] = NULL;
    while (p) {  /* for each string in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, nsize);  /* new position */
      p->u.hnext = vect[h];  /* chain it into array */
      vect[h] = p;
      p = hnext;
    }
  }
}